

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86.h
# Opt level: O0

void calculate_qcoeff_log_scale
               (__m128i *coeff,__m128i round,__m128i quant,__m128i *shift,int *log_scale)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m128i alVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  __m128i qcoeff;
  __m128i tmp1;
  __m128i tmp;
  int *log_scale_local;
  __m128i *shift_local;
  __m128i quant_local;
  __m128i round_local;
  __m128i *coeff_local;
  
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = in_XMM0_Qa;
  auVar1 = vpaddsw_avx((undefined1  [16])*coeff,auVar1);
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = in_XMM1_Qa;
  auVar2 = vpmulhw_avx(auVar1,auVar2);
  auVar1 = vpaddw_avx(auVar2,auVar1);
  auVar2 = vpmullw_avx(auVar1,*(undefined1 (*) [16])round[0]);
  auVar2 = vpsrlw_avx(auVar2,ZEXT416(0x10 - *(int *)round[1]));
  auVar1 = vpmulhw_avx(auVar1,*(undefined1 (*) [16])round[0]);
  auVar1 = vpsllw_avx(auVar1,ZEXT416(*(uint *)round[1]));
  alVar3 = (__m128i)vpor_avx(auVar2,auVar1);
  *coeff = alVar3;
  return;
}

Assistant:

static inline void calculate_qcoeff_log_scale(__m128i *coeff,
                                              const __m128i round,
                                              const __m128i quant,
                                              const __m128i *shift,
                                              const int *log_scale) {
  __m128i tmp, tmp1, qcoeff;
  qcoeff = _mm_adds_epi16(*coeff, round);
  tmp = _mm_mulhi_epi16(qcoeff, quant);
  qcoeff = _mm_add_epi16(tmp, qcoeff);
  tmp = _mm_mullo_epi16(qcoeff, *shift);
  tmp = _mm_srli_epi16(tmp, (16 - *log_scale));
  tmp1 = _mm_mulhi_epi16(qcoeff, *shift);
  tmp1 = _mm_slli_epi16(tmp1, *log_scale);
  *coeff = _mm_or_si128(tmp, tmp1);
}